

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexTriangleFilter::apply
          (PtexTriangleFilter *this,PtexTriangleKernel *k,int faceid,FaceInfo *f)

{
  undefined1 uVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  PtexTriangleKernelIter kodd;
  PtexTriangleKernelIter keven;
  PtexTriangleKernelIter PStack_98;
  PtexTriangleKernelIter local_5c;
  PtexFaceData *dh;
  
  uVar1 = (f->res).ulog2;
  cVar2 = uVar1;
  if ((char)*(undefined4 *)k < (char)uVar1) {
    cVar2 = (char)*(undefined4 *)k;
  }
  (k->res).ulog2 = cVar2;
  (k->res).vlog2 = cVar2;
  PtexTriangleKernel::clampExtent(k);
  PtexTriangleKernel::getIterators(k,&local_5c,&PStack_98);
  if ((local_5c.valid != false) || (PStack_98.valid == true)) {
    iVar3 = (*this->_tx->_vptr_PtexTexture[0x14])(this->_tx,(ulong)(uint)faceid,(ulong)*(uint *)k);
    dh = (PtexFaceData *)CONCAT44(extraout_var,iVar3);
    if (dh != (PtexFaceData *)0x0) {
      if (local_5c.valid == true) {
        applyIter(this,&local_5c,dh);
      }
      if (PStack_98.valid == true) {
        applyIter(this,&PStack_98,dh);
      }
      (*dh->_vptr_PtexFaceData[2])(dh);
    }
  }
  return;
}

Assistant:

void PtexTriangleFilter::apply(PtexTriangleKernel& k, int faceid, const Ptex::FaceInfo& f)
{
    // clamp kernel face (resolution and extent)
    k.clampRes(f.res);
    k.clampExtent();

    // build kernel iterators
    PtexTriangleKernelIter keven, kodd;
    k.getIterators(keven, kodd);
    if (!keven.valid && !kodd.valid) return;

    // get face data, and apply
    PtexPtr<PtexFaceData> dh ( _tx->getData(faceid, k.res) );
    if (!dh) return;

    if (keven.valid) applyIter(keven, dh);
    if (kodd.valid) applyIter(kodd, dh);
}